

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

int __thiscall ev3dev::device::get_attr_int(device *this,string *name)

{
  error_code __ec;
  error_code __ec_00;
  ulong uVar1;
  ifstream *this_00;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int result;
  ifstream *is;
  int attempt;
  string *path;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar3;
  int local_5c;
  string *in_stack_ffffffffffffffa8;
  system_error *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  error_category *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    uVar2 = __cxa_allocate_exception(0x20);
    std::make_error_code(0);
    __ec_00._M_cat._0_4_ = in_stack_ffffffffffffffd0;
    __ec_00._0_8_ = in_stack_ffffffffffffffc8;
    __ec_00._M_cat._4_4_ = in_stack_ffffffffffffffd4;
    std::system_error::system_error
              ((system_error *)in_stack_ffffffffffffffc0,__ec_00,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  path = (string *)&stack0xffffffffffffffa8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),in_RDI);
  this_00 = anon_unknown_20::ifstream_open(path);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  uVar1 = std::ifstream::is_open();
  if ((uVar1 & 1) == 0) {
    uVar3 = 1;
    uVar2 = __cxa_allocate_exception(0x20);
    std::make_error_code(0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffff68),in_RDI);
    __ec._M_cat = in_stack_ffffffffffffffc0;
    __ec._0_8_ = in_stack_ffffffffffffffb8;
    std::system_error::system_error(in_stack_ffffffffffffffb0,__ec,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  local_5c = 0;
  std::istream::operator>>((istream *)this_00,&local_5c);
  return local_5c;
}

Assistant:

int device::get_attr_int(const std::string &name) const {
    using namespace std;

    if (_path.empty())
        throw system_error(make_error_code(errc::function_not_supported), "no device connected");

    for(int attempt = 0; attempt < 2; ++attempt) {
        ifstream &is = ifstream_open(_path + name);
        if (is.is_open()) {
            int result = 0;
            try {
                is >> result;
                return result;
            } catch(...) {
                // This could mean the sysfs attribute was recreated and the
                // corresponding file handle got stale. Lets close the file and try
                // again (once):
                if (attempt != 0) throw;

                is.close();
                is.clear();
            }
        } else break;
    }
    throw system_error(make_error_code(errc::no_such_device), _path+name);
}